

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

int nsync::nsync_mu_is_reader(nsync_mu *mu)

{
  uint uVar1;
  uint32_t word;
  nsync_mu *mu_local;
  
  uVar1 = std::atomic_load_explicit<unsigned_int>(&mu->word,memory_order_relaxed);
  if ((uVar1 & 0xffffff01) == 0) {
    nsync_panic_("nsync_mu not held in some mode\n");
  }
  return (int)((uVar1 & 1) == 0);
}

Assistant:

int nsync_mu_is_reader (const nsync_mu *mu) {
	uint32_t word;
	IGNORE_RACES_START ();
	word = ATM_LOAD (&mu->word);
	if ((word & MU_ANY_LOCK) == 0) {
		nsync_panic_ ("nsync_mu not held in some mode\n");
	}
	IGNORE_RACES_END ();
	return ((word & MU_WLOCK) == 0);
}